

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<float,_gimage::PixelTraits<float>_> *
gimage::downscaleImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,int factor)

{
  float fVar1;
  float ***pppfVar2;
  long lVar3;
  long lVar4;
  float ***pppfVar5;
  float ***pppfVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long i;
  long lVar12;
  int ii;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  float fVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  float fVar22;
  
  if (factor < 2) {
    Image<float,_gimage::PixelTraits<float>_>::Image(__return_storage_ptr__,image);
  }
  else {
    uVar21 = (ulong)(uint)factor;
    Image<float,_gimage::PixelTraits<float>_>::Image
              (__return_storage_ptr__,(long)(image->width + (uVar21 - 1)) / (long)uVar21,
               (long)((uVar21 - 1) + image->height) / (long)uVar21,image->depth);
    pppfVar2 = __return_storage_ptr__->img;
    lVar3 = image->height;
    uVar15 = 0;
    uVar7 = (ulong)(uint)image->depth;
    if (image->depth < 1) {
      uVar7 = uVar15;
    }
    lVar4 = image->width;
    for (; uVar15 != uVar7; uVar15 = uVar15 + 1) {
      pfVar16 = *pppfVar2[uVar15];
      lVar12 = image->width;
      pppfVar5 = image->img;
      lVar9 = 0;
      while (lVar18 = lVar9, lVar9 = lVar18 + uVar21, lVar9 <= lVar3) {
        pppfVar6 = image->img;
        lVar8 = 0;
        lVar20 = 0;
        while ((long)(lVar20 + uVar21) <= lVar12) {
          lVar14 = (long)pppfVar6[uVar15][lVar18] + lVar8;
          iVar19 = 0;
          fVar22 = 0.0;
          for (iVar10 = 0; iVar10 != factor; iVar10 = iVar10 + 1) {
            for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
              fVar1 = *(float *)(lVar14 + uVar13 * 4);
              fVar17 = ABS(fVar1);
              if ((uint)fVar17 < 0x7f800000) {
                fVar22 = fVar22 + fVar1;
              }
              iVar19 = iVar19 + (uint)((uint)fVar17 < 0x7f800000);
            }
            lVar14 = lVar14 + lVar12 * 4;
          }
          if (iVar19 < 1) {
            fVar22 = INFINITY;
          }
          else {
            fVar22 = fVar22 / (float)iVar19;
          }
          *pfVar16 = fVar22;
          pfVar16 = pfVar16 + 1;
          lVar8 = lVar8 + uVar21 * 4;
          lVar20 = lVar20 + uVar21;
        }
        if (lVar20 < lVar12) {
          lVar8 = lVar8 + (long)pppfVar5[uVar15][lVar18];
          iVar10 = 0;
          fVar22 = 0.0;
          for (iVar19 = 0; iVar19 != factor; iVar19 = iVar19 + 1) {
            for (uVar13 = 0; (uVar21 != uVar13 && ((long)(lVar20 + uVar13) < lVar12));
                uVar13 = uVar13 + 1) {
              fVar1 = *(float *)(lVar8 + uVar13 * 4);
              fVar17 = ABS(fVar1);
              if ((uint)fVar17 < 0x7f800000) {
                fVar22 = fVar22 + fVar1;
              }
              iVar10 = iVar10 + (uint)((uint)fVar17 < 0x7f800000);
            }
            lVar8 = lVar8 + lVar12 * 4;
          }
          if (iVar10 < 1) {
            fVar22 = INFINITY;
          }
          else {
            fVar22 = fVar22 / (float)iVar10;
          }
          *pfVar16 = fVar22;
          pfVar16 = pfVar16 + 1;
        }
      }
      if (lVar18 < lVar3) {
        pppfVar5 = image->img;
        lVar9 = 0;
        for (lVar12 = 0; lVar12 < lVar4; lVar12 = lVar12 + uVar21) {
          lVar20 = (long)pppfVar5[uVar15][lVar18] + lVar9;
          fVar22 = 0.0;
          iVar10 = 0;
          for (uVar13 = 0; (uVar13 < uVar21 && ((long)(lVar18 + uVar13) < lVar3));
              uVar13 = uVar13 + 1) {
            for (uVar11 = 0; (uVar21 != uVar11 && ((long)(lVar12 + uVar11) < lVar4));
                uVar11 = uVar11 + 1) {
              fVar1 = *(float *)(lVar20 + uVar11 * 4);
              fVar17 = ABS(fVar1);
              if ((uint)fVar17 < 0x7f800000) {
                fVar22 = fVar22 + fVar1;
              }
              iVar10 = iVar10 + (uint)((uint)fVar17 < 0x7f800000);
            }
            lVar20 = lVar20 + lVar4 * 4;
          }
          if (iVar10 < 1) {
            fVar22 = INFINITY;
          }
          else {
            fVar22 = fVar22 / (float)iVar10;
          }
          *pfVar16 = fVar22;
          pfVar16 = pfVar16 + 1;
          lVar9 = lVar9 + uVar21 * 4;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Image<float> downscaleImage(const Image<float> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<float> ret((image.getWidth()+factor-1)/factor,
                   (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    float *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      // average over factor*factor pixels of the input image

      while (i+factor <= image.getWidth())
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor; ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }

        i+=factor;
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<float>::work_t v=0;
        int n=0;

        const float *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValidS(in[ii]))
            {
              v+=in[ii];
              n++;
            }
          }

          in+=image.getWidth();
        }

        if (n > 0)
        {
          *out++=static_cast<typename Image<float>::store_t>(v/n);
        }
        else
        {
          *out++=PixelTraits<float>::invalid();
        }
      }
    }
  }

  return ret;
}